

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O1

DdTlcInfo * Cudd_FindTwoLiteralClauses(DdManager *dd,DdNode *f)

{
  DdHalfWord *pDVar1;
  size_t __size;
  DdHalfWord DVar2;
  int iVar3;
  uint uVar4;
  st__table *table;
  BitVector *pBVar5;
  DdTlcInfo *pDVar6;
  st__generator *gen;
  DdHalfWord *pDVar7;
  DdNode *node;
  DdTlcInfo *tlc;
  DdNode *local_40;
  DdTlcInfo *local_38;
  
  if (*(int *)((ulong)f & 0xfffffffffffffffe) == 0x7fffffff) {
    pDVar6 = (DdTlcInfo *)malloc(0x18);
    if (pDVar6 != (DdTlcInfo *)0x0) {
      pDVar7 = (DdHalfWord *)malloc(8);
      pDVar6->vars = pDVar7;
      if (pDVar7 != (DdHalfWord *)0x0) {
        pDVar7[0] = 0;
        pDVar7[1] = 0;
        pDVar6->phases = (long *)0x0;
        pDVar6->cnt = 0;
        return pDVar6;
      }
      free(pDVar6);
    }
    return (DdTlcInfo *)0x0;
  }
  iVar3 = dd->size;
  table = st__init_table(st__ptrcmp,st__ptrhash);
  if (table != (st__table *)0x0) {
    __size = (long)(iVar3 + -1 >> 6) * 8 + 8;
    pBVar5 = (BitVector *)malloc(__size);
    if (pBVar5 == (BitVector *)0x0) {
      pBVar5 = (BitVector *)0x0;
    }
    else {
      memset(pBVar5,0,__size);
    }
    Tolv = pBVar5;
    if (pBVar5 == (BitVector *)0x0) {
      st__free_table(table);
    }
    else {
      pBVar5 = (BitVector *)malloc(__size);
      if (pBVar5 == (BitVector *)0x0) {
        pBVar5 = (BitVector *)0x0;
      }
      else {
        memset(pBVar5,0,__size);
      }
      Tolp = pBVar5;
      if (pBVar5 == (BitVector *)0x0) {
        st__free_table(table);
        pBVar5 = Tolv;
      }
      else {
        pBVar5 = (BitVector *)malloc(__size);
        if (pBVar5 == (BitVector *)0x0) {
          pBVar5 = (BitVector *)0x0;
        }
        else {
          memset(pBVar5,0,__size);
        }
        Eolv = pBVar5;
        if (pBVar5 == (BitVector *)0x0) {
          st__free_table(table);
          pBVar5 = Tolp;
          if (Tolv != (BitVector *)0x0) {
            free(Tolv);
            pBVar5 = Tolp;
          }
        }
        else {
          pBVar5 = (BitVector *)malloc(__size);
          if (pBVar5 == (BitVector *)0x0) {
            pBVar5 = (BitVector *)0x0;
          }
          else {
            memset(pBVar5,0,__size);
          }
          Eolp = pBVar5;
          if (pBVar5 != (BitVector *)0x0) {
            pDVar6 = ddFindTwoLiteralClausesRecur(dd,f,table);
            gen = st__init_gen(table);
            iVar3 = st__gen(gen,(char **)&local_40,(char **)&local_38);
            if (iVar3 != 0) {
              do {
                if (local_40 != f) {
                  Cudd_tlcInfoFree(local_38);
                }
                iVar3 = st__gen(gen,(char **)&local_40,(char **)&local_38);
              } while (iVar3 != 0);
            }
            st__free_gen(gen);
            st__free_table(table);
            if (Tolv != (BitVector *)0x0) {
              free(Tolv);
            }
            if (Tolp != (BitVector *)0x0) {
              free(Tolp);
            }
            if (Eolv != (BitVector *)0x0) {
              free(Eolv);
            }
            if (Eolp != (BitVector *)0x0) {
              free(Eolp);
            }
            if (pDVar6 == (DdTlcInfo *)0x0) {
              return (DdTlcInfo *)0x0;
            }
            pDVar7 = pDVar6->vars + 1;
            uVar4 = 0xfffffffe;
            do {
              DVar2 = *pDVar7;
              uVar4 = uVar4 + 2;
              pDVar1 = pDVar7 + -1;
              pDVar7 = pDVar7 + 2;
            } while (DVar2 != 0 || *pDVar1 != 0);
            pDVar6->cnt = uVar4 >> 1;
            return pDVar6;
          }
          st__free_table(table);
          if (Tolv != (BitVector *)0x0) {
            free(Tolv);
          }
          pBVar5 = Eolv;
          if (Tolp != (BitVector *)0x0) {
            free(Tolp);
            pBVar5 = Eolv;
          }
        }
      }
      if (pBVar5 != (BitVector *)0x0) {
        free(pBVar5);
      }
    }
  }
  return (DdTlcInfo *)0x0;
}

Assistant:

DdTlcInfo *
Cudd_FindTwoLiteralClauses(
  DdManager * dd,
  DdNode * f)
{
    DdTlcInfo *res;
    st__table *table;
    st__generator *gen;
    DdTlcInfo *tlc;
    DdNode *node;
    int size = dd->size;

    if (Cudd_IsConstant(f)) {
        res = emptyClauseSet();
        return(res);
    }
    table = st__init_table( st__ptrcmp, st__ptrhash);
    if (table == NULL) return(NULL);
    Tolv = bitVectorAlloc(size);
    if (Tolv == NULL) {
        st__free_table(table);
        return(NULL);
    }
    Tolp = bitVectorAlloc(size);
    if (Tolp == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        return(NULL);
    }
    Eolv = bitVectorAlloc(size);
    if (Eolv == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        bitVectorFree(Tolp);
        return(NULL);
    }
    Eolp = bitVectorAlloc(size);
    if (Eolp == NULL) {
        st__free_table(table);
        bitVectorFree(Tolv);
        bitVectorFree(Tolp);
        bitVectorFree(Eolv);
        return(NULL);
    }

    res = ddFindTwoLiteralClausesRecur(dd,f,table);
    /* Dispose of table contents and free table. */
    st__foreach_item(table, gen, (const char **)&node, (char **)&tlc) {
        if (node != f) {
            Cudd_tlcInfoFree(tlc);
        }
    }
    st__free_table(table);
    bitVectorFree(Tolv);
    bitVectorFree(Tolp);
    bitVectorFree(Eolv);
    bitVectorFree(Eolp);

    if (res != NULL) {
        int i;
        for (i = 0; !sentinelp(res->vars[i], res->vars[i+1]); i += 2);
        res->cnt = i >> 1;
    }

    return(res);

}